

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Point_Object_State_PDU.cpp
# Opt level: O1

KString * __thiscall
KDIS::PDU::Point_Object_State_PDU::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,Point_Object_State_PDU *this)

{
  ostream *poVar1;
  KCHAR8 in_CL;
  KUINT16 Tabs;
  KUINT16 Tabs_00;
  KStringStream ss;
  KString local_2e0;
  KString local_2c0;
  KString local_2a0;
  KString local_280;
  KString local_260;
  KString local_240;
  KString local_220;
  KString local_200;
  KString local_1e0;
  KString local_1c0;
  stringstream local_1a0 [16];
  ostream local_190 [112];
  ios_base local_120 [264];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  Header7::GetAsString_abi_cxx11_(&local_200,(Header7 *)this);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (local_190,local_200._M_dataplus._M_p,local_200._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"-Point Object State PDU-\n",0x19);
  Object_State_Header::GetAsString_abi_cxx11_(&local_220,&this->super_Object_State_Header);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,local_220._M_dataplus._M_p,local_220._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"Modification:\n",0xe);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\tLocation:     ",0xf);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\tOrientation:  ",0xf);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"Object Type:  ",0xe);
  DATA_TYPE::ObjectType::GetAsString_abi_cxx11_(&local_240,&this->m_ObjTyp);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,local_240._M_dataplus._M_p,local_240._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"Location:     ",0xe);
  DATA_TYPE::WorldCoordinates::GetAsString_abi_cxx11_(&local_260,&this->m_Loc);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,local_260._M_dataplus._M_p,local_260._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"Orientation:  ",0xe);
  DATA_TYPE::EulerAngles::GetAsString_abi_cxx11_(&local_280,&this->m_Ori);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,local_280._M_dataplus._M_p,local_280._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"Requestor ID:\n",0xe);
  DATA_TYPE::SimulationIdentifier::GetAsString_abi_cxx11_(&local_1c0,&this->m_ReqID);
  UTILS::IndentString(&local_2a0,&local_1c0,Tabs,in_CL);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,local_2a0._M_dataplus._M_p,local_2a0._M_string_length);
  DATA_TYPE::PointObjectAppearance::GetAsString_abi_cxx11_(&local_2c0,&this->m_Apperance);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,local_2c0._M_dataplus._M_p,local_2c0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"Receiving ID:\n",0xe);
  DATA_TYPE::SimulationIdentifier::GetAsString_abi_cxx11_(&local_1e0,&this->m_RecvID);
  UTILS::IndentString(&local_2e0,&local_1e0,Tabs_00,in_CL);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,local_2e0._M_dataplus._M_p,local_2e0._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
    operator_delete(local_2e0._M_dataplus._M_p,local_2e0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
    operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
    operator_delete(local_2c0._M_dataplus._M_p,local_2c0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
    operator_delete(local_2a0._M_dataplus._M_p,local_2a0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
    operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_280._M_dataplus._M_p != &local_280.field_2) {
    operator_delete(local_280._M_dataplus._M_p,local_280.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_260._M_dataplus._M_p != &local_260.field_2) {
    operator_delete(local_260._M_dataplus._M_p,local_260.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_240._M_dataplus._M_p != &local_240.field_2) {
    operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220._M_dataplus._M_p != &local_220.field_2) {
    operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200._M_dataplus._M_p != &local_200.field_2) {
    operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  std::ios_base::~ios_base(local_120);
  return __return_storage_ptr__;
}

Assistant:

KString Point_Object_State_PDU::GetAsString() const
{
    KStringStream ss;

    ss << Header::GetAsString()
       << "-Point Object State PDU-\n"
       << Object_State_Header::GetAsString()
       << "Modification:\n"
       << "\tLocation:     " << ( KUINT16 )m_ModificationUnion.m_ui8LocBit << "\n"
       << "\tOrientation:  " << ( KUINT16 )m_ModificationUnion.m_ui8OriBit << "\n"
       << "Object Type:  "   << m_ObjTyp.GetAsString()
       << "Location:     "   << m_Loc.GetAsString()
       << "Orientation:  "   << m_Ori.GetAsString()
       << "Requestor ID:\n"  << IndentString( m_ReqID.GetAsString(), 1 )
       << m_Apperance.GetAsString()
       << "Receiving ID:\n"  << IndentString( m_RecvID.GetAsString(), 1 );

    return ss.str();
}